

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeblock.cpp
# Opt level: O1

CodeBlock * __thiscall cppgenerate::CodeBlock::operator<<(CodeBlock *this,CodeBlock *other)

{
  char *local_30;
  long local_28;
  char local_20 [16];
  
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return this;
}

Assistant:

CodeBlock& CodeBlock::operator<<( const CodeBlock& other ){
    m_text << other.m_text.str();

    return *this;
}